

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.c
# Opt level: O0

_Bool check_descriptor_scriptpubkey_error(char *function,char *descriptor,uint32_t network)

{
  uint uVar1;
  uint32_t desc_index;
  uint32_t desc_depth;
  uint32_t flag;
  uchar script [520];
  size_t written;
  int ret;
  uint32_t network_local;
  char *descriptor_local;
  char *function_local;
  
  script[0x200] = '\0';
  script[0x201] = '\0';
  script[0x202] = '\0';
  script[0x203] = '\0';
  script[0x204] = '\0';
  script[0x205] = '\0';
  script[0x206] = '\0';
  script[0x207] = '\0';
  uVar1 = wally_descriptor_to_scriptpubkey
                    (descriptor,g_miniscript_keyname_list,g_miniscript_keyvalue_list,0xb,0,network,0
                     ,0,0,(uchar *)&desc_depth,0x208,(size_t *)(script + 0x200));
  if (uVar1 == 0xfffffffe) {
    function_local._7_1_ = true;
  }
  else if (uVar1 == 0) {
    printf("wally_descriptor_to_scriptpubkey Fail[Not Error] name[%s]\n",function);
    function_local._7_1_ = false;
  }
  else {
    printf("wally_descriptor_to_scriptpubkey NG[%d]\n",(ulong)uVar1);
    function_local._7_1_ = false;
  }
  return function_local._7_1_;
}

Assistant:

static bool check_descriptor_scriptpubkey_error(const char *function,
                                                const char *descriptor,
                                                const uint32_t network)
{
    int ret;
    size_t written = 0;
    unsigned char script[520];
    uint32_t flag = 0;
    uint32_t desc_depth = 0;
    uint32_t desc_index = 0;

    ret = wally_descriptor_to_scriptpubkey(
        descriptor,
        (const char **)g_miniscript_keyname_list,
        (const char **)g_miniscript_keyvalue_list,
        sizeof(g_miniscript_keyname_list) / sizeof(char *),
        0,
        network,
        desc_depth,
        desc_index,
        flag,
        script,
        sizeof(script),
        &written);
    if (ret == WALLY_EINVAL) {
        return true;
    } else if (ret != WALLY_OK) {
        printf("wally_descriptor_to_scriptpubkey NG[%d]\n", ret);
        return false;
    }
    printf("wally_descriptor_to_scriptpubkey Fail[Not Error] name[%s]\n", function);

    return false;
}